

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::setCategoryWeights
          (BeagleCPUImpl<double,_1,_0> *this,int categoryWeightsIndex,double *inCategoryWeights)

{
  uint uVar1;
  double **ppdVar2;
  int iVar3;
  double *pdVar4;
  
  iVar3 = -5;
  if ((-1 < categoryWeightsIndex) && (categoryWeightsIndex < this->kEigenDecompCount)) {
    ppdVar2 = this->gCategoryWeights;
    uVar1 = this->kCategoryCount;
    pdVar4 = ppdVar2[(uint)categoryWeightsIndex];
    if (pdVar4 == (double *)0x0) {
      pdVar4 = (double *)malloc((long)(int)uVar1 * 8);
      ppdVar2[(uint)categoryWeightsIndex] = pdVar4;
      pdVar4 = this->gCategoryWeights[(uint)categoryWeightsIndex];
      if (pdVar4 == (double *)0x0) {
        return -2;
      }
    }
    memcpy(pdVar4,inCategoryWeights,(ulong)uVar1 << 3);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::setCategoryWeights(int categoryWeightsIndex,
                                                 const double* inCategoryWeights) {
    if (categoryWeightsIndex < 0 || categoryWeightsIndex >= kEigenDecompCount)
        return BEAGLE_ERROR_OUT_OF_RANGE;
    if (gCategoryWeights[categoryWeightsIndex] == NULL) {
        gCategoryWeights[categoryWeightsIndex] = (REALTYPE*) malloc(sizeof(REALTYPE) * kCategoryCount);
        if (gCategoryWeights[categoryWeightsIndex] == 0L)
            return BEAGLE_ERROR_OUT_OF_MEMORY;
    }
    beagleMemCpy(gCategoryWeights[categoryWeightsIndex], inCategoryWeights, kCategoryCount);

    return BEAGLE_SUCCESS;
}